

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkformat_str.c
# Opt level: O0

int ktx_strcasecmp(char *s1,char *s2)

{
  int iVar1;
  int iVar2;
  byte *in_RSI;
  byte *in_RDI;
  uchar *us2;
  uchar *us1;
  byte *local_28;
  byte *local_20;
  
  local_28 = in_RSI;
  local_20 = in_RDI;
  while( true ) {
    iVar1 = tolower((uint)*local_20);
    iVar2 = tolower((uint)*local_28);
    if (iVar1 != iVar2) {
      iVar1 = tolower((uint)*local_20);
      iVar2 = tolower((uint)*local_28);
      return iVar1 - iVar2;
    }
    if (*local_20 == 0) break;
    local_20 = local_20 + 1;
    local_28 = local_28 + 1;
  }
  return 0;
}

Assistant:

static int ktx_strcasecmp(const char* s1, const char* s2) {
    const unsigned char* us1 = (const unsigned char*) s1;
    const unsigned char* us2 = (const unsigned char*) s2;

    while (tolower(*us1) == tolower(*us2)) {
        if (*us1 == '\0')
            return 0;
        ++us1;
        ++us2;
    }
    return tolower(*us1) - tolower(*us2);
}